

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected-main.t.hpp
# Opt level: O2

ostream * lest::operator<<(ostream *os,expected<int,_int> *v)

{
  bool bVar1;
  ostream *poVar2;
  string *this;
  bool bVar3;
  allocator local_79;
  ulong *local_78;
  undefined8 local_70;
  ulong local_68;
  undefined8 uStack_60;
  ulong *local_58 [2];
  ulong local_48;
  undefined8 uStack_40;
  ulong *local_38;
  undefined8 local_30;
  undefined1 local_28;
  uint7 uStack_27;
  undefined8 uStack_20;
  
  poVar2 = std::operator<<(os,"[expected:");
  bVar1 = (v->contained).super_storage_t_impl<int,_int>.m_has_value;
  if (bVar1 == true) {
    nonstd::expected_lite::expected<int,_int>::operator*(v);
    to_string_abi_cxx11_(0);
    local_58[0] = &local_48;
    if (local_78 == &local_68) {
      uStack_40 = uStack_60;
    }
    else {
      local_58[0] = local_78;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"[empty]",&local_79);
    if (local_38 == (ulong *)&local_28) {
      uStack_60 = uStack_20;
      local_38 = &local_68;
    }
    local_68 = (ulong)uStack_27 << 8;
    local_30 = 0;
    local_28 = 0;
    bVar3 = local_38 == &local_68;
    local_58[0] = local_38;
    local_38 = (ulong *)&local_28;
    if (bVar3) {
      uStack_40 = uStack_60;
      local_58[0] = &local_48;
    }
  }
  local_78 = &local_68;
  local_70 = 0;
  local_68 = local_68 & 0xffffffffffffff00;
  poVar2 = std::operator<<(poVar2,(string *)local_58);
  poVar2 = std::operator<<(poVar2,"]");
  std::__cxx11::string::~string((string *)local_58);
  this = (string *)&local_78;
  if (bVar1 == false) {
    std::__cxx11::string::~string(this);
    this = (string *)&local_38;
  }
  std::__cxx11::string::~string(this);
  return poVar2;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::expected<T,E> const & v )
{
    using lest::to_string;
    return os << "[expected:" << (v ? to_string(*v) : "[empty]") << "]";
}